

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O1

void __thiscall ASDCP::Dictionary::Dump(Dictionary *this,FILE *stream)

{
  char *pcVar1;
  long lVar2;
  UL TmpUL;
  char str_buf [64];
  UL local_98;
  char local_78 [72];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  lVar2 = 0xa8;
  do {
    if (*(long *)(&(this->m_md_lookup)._M_t._M_impl.field_0x0 + lVar2) != 0) {
      local_98.super_Identifier<16U>.m_HasValue = true;
      local_98.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)((long)this + lVar2 + -0x18);
      local_98.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)((long)this + lVar2 + -0x10);
      local_98.super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_0021f038;
      pcVar1 = UL::EncodeString(&local_98,local_78,0x40);
      fprintf((FILE *)stream,"%s: %s\n",pcVar1,
              *(undefined8 *)(&(this->m_md_lookup)._M_t._M_impl.field_0x0 + lVar2));
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x4968);
  return;
}

Assistant:

void
ASDCP::Dictionary::Dump(FILE* stream) const
{
  if ( stream == 0 )
    stream = stderr;

  MDD_t di = (MDD_t)0;
  char     str_buf[64];

  while ( di < MDD_Max )
    {
      if ( m_MDD_Table[di].name != 0 )
	{
	  UL TmpUL(m_MDD_Table[di].ul);
	  fprintf(stream, "%s: %s\n", TmpUL.EncodeString(str_buf, 64), m_MDD_Table[di].name);
	}

      di = (MDD_t)(di + 1);
    }
}